

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O2

void __thiscall MetaSim::Event::post(Event *this,Tick myTime,bool disp)

{
  unsigned_long uVar1;
  Simulation *pSVar2;
  Tick TVar3;
  ostream *poVar4;
  Exc *pEVar5;
  pair<std::_Rb_tree_iterator<MetaSim::Event_*>,_bool> pVar6;
  allocator local_2d9;
  Tick local_2d8;
  Tick myTime_local;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream str;
  ostream local_198 [376];
  
  myTime_local = myTime;
  if (this->_isInQueue == true) {
    std::__cxx11::stringstream::stringstream((stringstream *)&str);
    poVar4 = std::operator<<(local_198,"Time: ");
    pSVar2 = Simulation::getInstance();
    local_2d8 = Simulation::getTime(pSVar2);
    poVar4 = operator<<(poVar4,&local_2d8);
    poVar4 = std::operator<<(poVar4," -- Event");
    poVar4 = std::operator<<(poVar4,*(char **)(this->_vptr_Event[-1] + 8) +
                                    (**(char **)(this->_vptr_Event[-1] + 8) == '*'));
    std::operator<<(poVar4," already posted");
    pEVar5 = (Exc *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::string((string *)&local_1e8,"Event",(allocator *)&local_2d8);
    std::__cxx11::string::string((string *)&local_208,"event.cpp",&local_2d9);
    Exc::Exc(pEVar5,&local_1c8,&local_1e8,&local_208);
    __cxa_throw(pEVar5,&Exc::typeinfo,BaseExc::~BaseExc);
  }
  pSVar2 = Simulation::getInstance();
  TVar3 = Simulation::getTime(pSVar2);
  if (TVar3.v <= myTime_local.v) {
    setTime(this,myTime_local);
    uVar1 = counter + 1;
    this->_order = counter;
    counter = uVar1;
    _str = this;
    pVar6 = std::
            _Rb_tree<MetaSim::Event*,MetaSim::Event*,std::_Identity<MetaSim::Event*>,MetaSim::Event::Cmp,std::allocator<MetaSim::Event*>>
            ::_M_insert_unique<MetaSim::Event*const&>
                      ((_Rb_tree<MetaSim::Event*,MetaSim::Event*,std::_Identity<MetaSim::Event*>,MetaSim::Event::Cmp,std::allocator<MetaSim::Event*>>
                        *)_eventQueue,(Event **)&str);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      this->_isInQueue = true;
      this->_disposable = disp;
      (*this->_vptr_Event[3])(this);
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&str);
    poVar4 = std::operator<<(local_198,"Time: ");
    pSVar2 = Simulation::getInstance();
    local_2d8 = Simulation::getTime(pSVar2);
    poVar4 = operator<<(poVar4,&local_2d8);
    poVar4 = std::operator<<(poVar4," -- Posting event");
    poVar4 = std::operator<<(poVar4,*(char **)(this->_vptr_Event[-1] + 8) +
                                    (**(char **)(this->_vptr_Event[-1] + 8) == '*'));
    poVar4 = std::operator<<(poVar4," Already in queue!, at time = ");
    operator<<(poVar4,&myTime_local);
    pEVar5 = (Exc *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::string((string *)&local_2a8,"Event",(allocator *)&local_2d8);
    std::__cxx11::string::string((string *)&local_2c8,"event.cpp",&local_2d9);
    Exc::Exc(pEVar5,&local_288,&local_2a8,&local_2c8);
    __cxa_throw(pEVar5,&Exc::typeinfo,BaseExc::~BaseExc);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&str);
  poVar4 = std::operator<<(local_198,"Time: ");
  pSVar2 = Simulation::getInstance();
  local_2d8 = Simulation::getTime(pSVar2);
  poVar4 = operator<<(poVar4,&local_2d8);
  poVar4 = std::operator<<(poVar4," -- Posting event");
  poVar4 = std::operator<<(poVar4,*(char **)(this->_vptr_Event[-1] + 8) +
                                  (**(char **)(this->_vptr_Event[-1] + 8) == '*'));
  poVar4 = std::operator<<(poVar4," in the past at time: ");
  operator<<(poVar4,&myTime_local);
  pEVar5 = (Exc *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&local_248,"Event",(allocator *)&local_2d8);
  std::__cxx11::string::string((string *)&local_268,"event.cpp",&local_2d9);
  Exc::Exc(pEVar5,&local_228,&local_248,&local_268);
  __cxa_throw(pEVar5,&Exc::typeinfo,BaseExc::~BaseExc);
}

Assistant:

void Event::post(Tick myTime, bool disp) throw (Exc, BaseExc)
    {
        if (_isInQueue) {
            std::stringstream str;
            str << "Time: " << SIMUL.getTime() 
                << " -- Event" 
                << typeid(*this).name() << " already posted";
            throw Exc(str.str());
        }

        if (myTime < SIMUL.getTime()) {
            std::stringstream str;
            str << "Time: " << SIMUL.getTime() 
                << " -- Posting event" 
                << typeid(*this).name() << " in the past at time: " 
                << myTime;
            throw Exc(str.str());
        }

        setTime(myTime);

        _order = counter++;

        std::pair<EventQueue::iterator,bool> p;
        p =_eventQueue.insert(this);
    
        if (!p.second) {
            std::stringstream str;
            str << "Time: " << SIMUL.getTime() 
                << " -- Posting event" 
                << typeid(*this).name() << " Already in queue!, at time = " << myTime;
            throw Exc(str.str());
        }

        _isInQueue = true;
        _disposable = disp;

        DBGENTER(_EVENT_DBG_LEV);
        print();
        
    }